

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase251::run(TestCase251 *this)

{
  Reader reader;
  Builder builder;
  MessageReader *pMVar1;
  long *plVar2;
  Iface *pIVar3;
  byte *pbVar4;
  SegmentReader *node;
  ReaderOptions options;
  PipeWithSmallBuffer fds;
  Own<capnp::MessageReader,_std::nullptr_t> received;
  Own<kj::AsyncInputStream,_std::nullptr_t> input;
  FragmentingOutputStream output;
  AsyncIoContext ioContext;
  SocketOutputStream rawOutput;
  Thread thread;
  TestMessageBuilder message;
  PipeWithSmallBuffer local_250;
  PromiseBase local_248;
  MessageReader *local_240;
  undefined8 *local_238;
  long *local_230;
  Function<void_()> local_228;
  ArrayOutputStream local_218;
  undefined8 *local_1f8;
  long *local_1f0;
  PointerReader local_1d8;
  char *local_1b8;
  undefined *puStack_1b0;
  undefined8 local_1a8;
  FdOutputStream local_1a0;
  Reader local_190;
  Thread in_stack_fffffffffffffe90;
  SegmentBuilder *in_stack_fffffffffffffea8;
  CapTableBuilder *in_stack_fffffffffffffeb0;
  StructReader local_130;
  TestMessageBuilder local_100;
  
  PipeWithSmallBuffer::PipeWithSmallBuffer(&local_250);
  kj::setupAsyncIo();
  (*(code *)**(undefined8 **)local_218.fillPos)(&local_238,local_218.fillPos,local_250.fds[0],0);
  local_218.array.ptr = (uchar *)&local_1a0;
  local_1a0.super_OutputStream._vptr_OutputStream = (_func_int **)&PTR__FdOutputStream_006e3480;
  local_1a0.fd = local_250.fds[1];
  local_1a0.autoclose.fd = -1;
  local_218.super_BufferedOutputStream.super_OutputStream._vptr_OutputStream =
       (OutputStream)&PTR__ArrayOutputStream_006b9578;
  MallocMessageBuilder::MallocMessageBuilder(&local_100.super_MallocMessageBuilder,0,FIXED_SIZE);
  local_100.super_MallocMessageBuilder.super_MessageBuilder._vptr_MessageBuilder =
       (_func_int **)&PTR__TestMessageBuilder_006b95c0;
  local_100.desiredSegmentCount = 10;
  MessageBuilder::getRootInternal((Builder *)&local_190,(MessageBuilder *)&local_100);
  local_1d8.pointer = local_190.reader.pointer;
  local_1d8.segment = local_190.reader.segment;
  local_1d8.capTable = local_190.reader.capTable;
  PointerBuilder::getStruct
            ((StructBuilder *)&stack0xfffffffffffffea8,(PointerBuilder *)&local_1d8,
             (StructSize)0x140006,(word *)0x0);
  builder._builder.pointers = (WirePointer *)in_stack_fffffffffffffea8;
  builder._builder._0_24_ = in_stack_fffffffffffffe90;
  builder._builder._32_8_ = in_stack_fffffffffffffeb0;
  initTestMessage(builder);
  local_228.impl.ptr = (Iface *)operator_new(0x18);
  (local_228.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___006b9730;
  local_228.impl.ptr[1]._vptr_Iface = (_func_int **)&local_218;
  local_228.impl.ptr[2]._vptr_Iface = (_func_int **)&local_100;
  local_228.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<void()>::Impl<capnp::_::(anonymous_namespace)::TestCase251::run()::$_0>>
        ::instance;
  kj::Thread::Thread((Thread *)&stack0xfffffffffffffe90,&local_228);
  pIVar3 = local_228.impl.ptr;
  if (local_228.impl.ptr != (Iface *)0x0) {
    local_228.impl.ptr = (Iface *)0x0;
    (**(local_228.impl.disposer)->_vptr_Disposer)
              (local_228.impl.disposer,pIVar3->_vptr_Iface[-2] + (long)&pIVar3->_vptr_Iface);
  }
  options._8_8_ = 0x800000;
  options.traversalLimitInWords = (uint64_t)local_230;
  readMessage((AsyncInputStream *)&local_1d8,options,(ArrayPtr<capnp::word>)ZEXT816(0x40));
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async-test.c++"
  ;
  puStack_1b0 = &DAT_004d6248;
  local_1a8 = 0x1300000109;
  kj::Promise<kj::Own<capnp::MessageReader,_std::nullptr_t>_>::wait
            ((Promise<kj::Own<capnp::MessageReader,_std::nullptr_t>_> *)&local_248,&local_1d8);
  node = local_1d8.segment;
  if (local_1d8.segment != (SegmentReader *)0x0) {
    local_1d8.segment = (SegmentReader *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  MessageReader::getRootInternal(&local_190,local_240);
  local_1d8.pointer = local_190.reader.pointer;
  local_1d8.nestingLimit = local_190.reader.nestingLimit;
  local_1d8._28_4_ = local_190.reader._28_4_;
  local_1d8.segment = local_190.reader.segment;
  local_1d8.capTable = local_190.reader.capTable;
  PointerReader::getStruct(&local_130,&local_1d8,(word *)0x0);
  reader._reader.capTable = local_130.capTable;
  reader._reader.segment = local_130.segment;
  reader._reader.data = local_130.data;
  reader._reader.pointers = local_130.pointers;
  reader._reader.dataSize = local_130.dataSize;
  reader._reader.pointerCount = local_130.pointerCount;
  reader._reader._38_2_ = local_130._38_2_;
  reader._reader.nestingLimit = local_130.nestingLimit;
  reader._reader._44_4_ = local_130._44_4_;
  checkTestMessage(reader);
  pMVar1 = local_240;
  if (local_240 != (MessageReader *)0x0) {
    local_240 = (MessageReader *)0x0;
    (*(code *)**(undefined8 **)local_248.node.ptr)
              (local_248.node.ptr,
               (code *)((long)pMVar1->arenaSpace + (long)(pMVar1->_vptr_MessageReader[-2] + -0x18)))
    ;
  }
  kj::Thread::~Thread((Thread *)&stack0xfffffffffffffe90);
  TestMessageBuilder::~TestMessageBuilder(&local_100);
  kj::ArrayOutputStream::~ArrayOutputStream(&local_218);
  kj::FdOutputStream::~FdOutputStream(&local_1a0);
  plVar2 = local_230;
  if (local_230 != (long *)0x0) {
    local_230 = (long *)0x0;
    (**(code **)*local_238)(local_238,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  plVar2 = local_1f0;
  if (local_1f0 != (long *)0x0) {
    local_1f0 = (long *)0x0;
    (**(code **)*local_1f8)(local_1f8,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  pbVar4 = local_218.fillPos;
  if ((long *)local_218.fillPos != (long *)0x0) {
    local_218.fillPos = (byte *)0x0;
    (*(code *)**(undefined8 **)local_218.array.size_)
              (local_218.array.size_,(long)pbVar4 + *(long *)(*(long *)pbVar4 + -0x10));
  }
  PipeWithSmallBuffer::~PipeWithSmallBuffer(&local_250);
  return;
}

Assistant:

TEST(SchemaLoader, EnumerateNoPlaceholders) {
  SchemaLoader loader;
  Schema schema = loader.load(Schema::from<TestDefaults>().getProto());

  {
    auto list = loader.getAllLoaded();
    ASSERT_EQ(1u, list.size());
    EXPECT_TRUE(list[0] == schema);
  }

  Schema dep = schema.getDependency(typeId<TestAllTypes>());

  {
    auto list = loader.getAllLoaded();
    ASSERT_EQ(2u, list.size());
    if (list[0] == schema) {
      EXPECT_TRUE(list[1] == dep);
    } else {
      EXPECT_TRUE(list[0] == dep);
      EXPECT_TRUE(list[1] == schema);
    }
  }
}